

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall PruneReplayer::access_raytracing_pipelines(PruneReplayer *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*> *pipe;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  *__range1;
  PruneReplayer *this_local;
  
  __end1 = std::
           unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
           ::begin(&this->raytracing_pipelines);
  pipe = (pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*> *)
         std::
         unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
         ::end(&this->raytracing_pipelines);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                         *)&pipe);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
             ::operator*(&__end1);
    access_raytracing_pipeline(this,ppVar2->first,ppVar2->second);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void access_raytracing_pipelines()
	{
		for (auto &pipe : raytracing_pipelines)
			access_raytracing_pipeline(pipe.first, pipe.second);
	}